

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int itf8_encode(cram_fd *fd,int32_t val)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  size_t sStack_20;
  char buf [5];
  
  bVar2 = (byte)val;
  if ((uint)val < 0x80) {
    sStack_20 = 1;
    buf[0] = bVar2;
  }
  else {
    bVar1 = (byte)((uint)val >> 0x18);
    bVar4 = (byte)((uint)val >> 8);
    if ((uint)val < 0x4000) {
      buf[0] = bVar4 | 0x80;
      sStack_20 = 2;
      buf[1] = bVar2;
    }
    else {
      buf[1] = (char)((uint)val >> 0x10);
      if ((uint)val < 0x200000) {
        buf[0] = buf[1] | 0xc0;
        sStack_20 = 3;
        buf[1] = bVar4;
        buf[2] = bVar2;
      }
      else if ((uint)val < 0x10000000) {
        buf[0] = bVar1 | 0xe0;
        sStack_20 = 4;
        buf[2] = bVar4;
        buf[3] = bVar2;
      }
      else {
        buf[0] = bVar1 >> 4 | 0xf0;
        buf[1] = (char)((uint)val >> 0x14);
        buf[2] = (char)((uint)val >> 0xc);
        buf[3] = (char)((uint)val >> 4);
        buf[4] = bVar2 & 0xf;
        sStack_20 = 5;
      }
    }
  }
  sVar3 = hwrite(fd->fp,buf,sStack_20);
  return -(uint)(sVar3 != sStack_20);
}

Assistant:

int itf8_encode(cram_fd *fd, int32_t val) {
    char buf[5];
    int len = itf8_put(buf, val);
    return hwrite(fd->fp, buf, len) == len ? 0 : -1;
}